

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O3

AliHttpRequest * __thiscall
AliHttpRequest::AddRequestQuery(AliHttpRequest *this,string *field,string *value)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->query_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->query_);
  }
  pcVar1 = (field->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + field->_M_string_length);
  urlencode(&local_50,&local_70);
  _Var2._M_p = local_50._M_dataplus._M_p;
  pcVar1 = (value->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + value->_M_string_length);
  urlencode(&local_90,&local_b0);
  append_format_string(&this->query_,"%s=%s",_Var2._M_p,local_90._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

AliHttpRequest& AliHttpRequest::AddRequestQuery(std::string field, std::string value) {
  if(!this->query_.empty()) {
    query_.append("&");
  }
  append_format_string(query_, "%s=%s", urlencode(field).c_str(),  urlencode(value).c_str());
  return *this;
}